

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatAdapters.h
# Opt level: O0

void __thiscall llvm::detail::ErrorAdapter::~ErrorAdapter(ErrorAdapter *this)

{
  ErrorAdapter *this_local;
  
  ~ErrorAdapter(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

~ErrorAdapter() { consumeError(std::move(Item)); }